

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::PresetOptionalBoolHelper
               (optional<bool> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  _func_bool_bool_ptr_Value_ptr_cmJSONState_ptr *func;
  cmJSONState *state_local;
  Value *value_local;
  optional<bool> *out_local;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)::helper == '\0'
     ) {
    iVar2 = __cxa_guard_acquire(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      cmJSONHelperBuilder::Optional<bool,bool(*)(bool&,Json::Value_const*,cmJSONState*)>
                (&PresetOptionalBoolHelper::helper,(cmJSONHelperBuilder *)PresetBoolHelper,func);
      __cxa_atexit(std::function<bool_(std::optional<bool>_&,_const_Json::Value_*,_cmJSONState_*)>::
                   ~function,&PresetOptionalBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::function<bool_(std::optional<bool>_&,_const_Json::Value_*,_cmJSONState_*)>::
          operator()(&PresetOptionalBoolHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool PresetOptionalBoolHelper(cm::optional<bool>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper =
    JSONHelperBuilder::Optional<bool>(PresetBoolHelper);
  return helper(out, value, state);
}